

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VM.cpp
# Opt level: O0

bool __thiscall luna::VM::Call(VM *this,Value *a,Instruction i)

{
  Instruction in_EDX;
  long in_RSI;
  pair<const_char_*,_int> pos;
  CallCFuncException *e;
  int expect_result;
  int arg_count;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  Value *in_stack_ffffffffffffff70;
  State *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffffb0;
  Value *in_stack_ffffffffffffffb8;
  VM *in_stack_ffffffffffffffc0;
  undefined1 local_1;
  
  if ((*(int *)(in_RSI + 8) == 5) || (*(int *)(in_RSI + 8) == 9)) {
    Instruction::GetParamB(in_EDX);
    Instruction::GetParamC(in_EDX);
    local_1 = State::CallFunction(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                                  in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
  }
  else {
    ReportTypeError(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool VM::Call(Value *a, Instruction i)
    {
        if (a->type_ != ValueT_Closure &&
            a->type_ != ValueT_CFunction)
        {
            ReportTypeError(a, "call");
            return true;
        }

        try
        {
            int arg_count = Instruction::GetParamB(i) - 1;
            int expect_result = Instruction::GetParamC(i) - 1;
            return state_->CallFunction(a, arg_count, expect_result);
        } catch (const CallCFuncException &e)
        {
            // Calculate line number of the call
            auto pos = GetCurrentInstructionPos();
            throw RuntimeException(pos.first, pos.second, e.What().c_str());
        }
    }